

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteList.c
# Opt level: O2

void Io_WriteCellNet(Abc_Ntk_t *pNtk,char *pFileName)

{
  uint uVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  int iVar8;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteList.c"
                  ,0xe3,"void Io_WriteCellNet(Abc_Ntk_t *, char *)");
  }
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    pcVar2 = pNtk->pName;
    pcVar5 = Extra_TimeStamp();
    fprintf(__stream,"# CellNet file for network \"%s\" written by ABC on %s\n",pcVar2,pcVar5);
    for (iVar8 = 0; iVar8 < pNtk->vPis->nSize; iVar8 = iVar8 + 1) {
      pAVar6 = Abc_NtkPi(pNtk,iVar8);
      fprintf(__stream,"cell %d is 0\n",(ulong)(uint)pAVar6->Id);
    }
    for (iVar8 = 0; iVar8 < pNtk->vPos->nSize; iVar8 = iVar8 + 1) {
      pAVar6 = Abc_NtkPo(pNtk,iVar8);
      fprintf(__stream,"cell %d is 1\n",(ulong)(uint)pAVar6->Id);
    }
    for (iVar8 = 0; iVar8 < pNtk->vBoxes->nSize; iVar8 = iVar8 + 1) {
      pAVar6 = Abc_NtkBox(pNtk,iVar8);
      if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) {
        fprintf(__stream,"cell %d is 2\n",
                (ulong)*(uint *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] + 0x10
                                ));
      }
    }
    for (iVar8 = 0; iVar8 < pNtk->vObjs->nSize; iVar8 = iVar8 + 1) {
      pAVar6 = Abc_NtkObj(pNtk,iVar8);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
        fprintf(__stream,"cell %d is %d\n",(ulong)(uint)pAVar6->Id,
                (ulong)((pAVar6->vFanins).nSize + 3));
      }
    }
    for (iVar8 = 0; iVar8 < pNtk->vPis->nSize; iVar8 = iVar8 + 1) {
      pAVar6 = Abc_NtkPi(pNtk,iVar8);
      fprintf(__stream,"net %d  %d 0",(ulong)(uint)pAVar6->Id);
      for (lVar7 = 0; lVar7 < (pAVar6->vFanouts).nSize; lVar7 = lVar7 + 1) {
        pAVar3 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanouts).pArray[lVar7]];
        uVar1 = pAVar3->Id;
        iVar4 = Abc_ObjFanoutFaninNum(pAVar3,pAVar6);
        fprintf(__stream,"  %d %d",(ulong)uVar1,(ulong)(iVar4 + 1));
      }
      fputc(10,__stream);
    }
    for (iVar8 = 0; iVar8 < pNtk->vBoxes->nSize; iVar8 = iVar8 + 1) {
      pAVar6 = Abc_NtkBox(pNtk,iVar8);
      if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) {
        fprintf(__stream,"net %d  %d 0",
                (ulong)*(uint *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] + 0x10
                                ));
        pAVar6 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray];
        for (lVar7 = 0; lVar7 < (pAVar6->vFanouts).nSize; lVar7 = lVar7 + 1) {
          pAVar3 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanouts).pArray[lVar7]];
          uVar1 = pAVar3->Id;
          iVar4 = Abc_ObjFanoutFaninNum(pAVar3,pAVar6);
          fprintf(__stream,"  %d %d",(ulong)uVar1,(ulong)(iVar4 + 1));
        }
        fputc(10,__stream);
      }
    }
    for (iVar8 = 0; iVar8 < pNtk->vObjs->nSize; iVar8 = iVar8 + 1) {
      pAVar6 = Abc_NtkObj(pNtk,iVar8);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
        fprintf(__stream,"net %d  %d 0",(ulong)(uint)pAVar6->Id);
        for (lVar7 = 0; lVar7 < (pAVar6->vFanouts).nSize; lVar7 = lVar7 + 1) {
          pAVar3 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanouts).pArray[lVar7]];
          uVar1 = pAVar3->Id;
          iVar4 = Abc_ObjFanoutFaninNum(pAVar3,pAVar6);
          fprintf(__stream,"  %d %d",(ulong)uVar1,(ulong)(iVar4 + 1));
        }
        fputc(10,__stream);
      }
    }
    fputc(10,__stream);
    fclose(__stream);
    return;
  }
  fprintf(_stdout,"Io_WriteCellNet(): Cannot open the output file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Io_WriteCellNet( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;

    assert( Abc_NtkIsLogic(pNtk)  );

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteCellNet(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    fprintf( pFile, "# CellNet file for network \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );

    // the only tricky part with writing is handling latches:
    // each latch comes with (a) single-input latch-input node, (b) latch proper, (c) single-input latch-output node
    // we arbitrarily decide to use the interger ID of the latch-input node to represent the latch in the file
    // (this ID is used for both the cell and the net driven by that cell)

    // write the PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, "cell %d is 0\n", pObj->Id );
    // write the POs
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "cell %d is 1\n", pObj->Id );
    // write the latches (use the ID of latch input)
    Abc_NtkForEachLatch( pNtk, pObj, i )
        fprintf( pFile, "cell %d is 2\n", Abc_ObjFanin0(pObj)->Id );
    // write the logic nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        fprintf( pFile, "cell %d is %d\n", pObj->Id, 3+Abc_ObjFaninNum(pObj) );

    // write the nets driven by PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        fprintf( pFile, "net %d  %d 0", pObj->Id, pObj->Id );
        Abc_ObjForEachFanout( pObj, pFanout, k )
            fprintf( pFile, "  %d %d", pFanout->Id, 1 + Abc_ObjFanoutFaninNum(pFanout, pObj) );
	    fprintf( pFile, "\n" );
    }
    // write the nets driven by latches
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        fprintf( pFile, "net %d  %d 0", Abc_ObjFanin0(pObj)->Id, Abc_ObjFanin0(pObj)->Id );
        pObj = Abc_ObjFanout0(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            fprintf( pFile, "  %d %d", pFanout->Id, 1 + Abc_ObjFanoutFaninNum(pFanout, pObj) );
	    fprintf( pFile, "\n" );
    }
    // write the nets driven by nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        fprintf( pFile, "net %d  %d 0", pObj->Id, pObj->Id );
        Abc_ObjForEachFanout( pObj, pFanout, k )
            fprintf( pFile, "  %d %d", pFanout->Id, 1 + Abc_ObjFanoutFaninNum(pFanout, pObj) );
	    fprintf( pFile, "\n" );
    }

	fprintf( pFile, "\n" );
	fclose( pFile );
}